

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

SHWBufferLink * __thiscall
irr::video::COpenGLDriver::createHardwareBuffer(COpenGLDriver *this,IMeshBuffer *mb)

{
  int iVar1;
  u32 uVar2;
  E_HARDWARE_MAPPING EVar3;
  SHWBufferLink *_MeshBuffer;
  ulong uVar4;
  long *in_RSI;
  const_iterator in_RDI;
  SHWBufferLink_opengl *HWBuffer;
  SHWBufferLink_opengl *in_stack_ffffffffffffffb0;
  _List_node_base **this_00;
  iterator local_38;
  _List_const_iterator<irr::video::CNullDriver::SHWBufferLink_*> local_30;
  _List_node_base *local_28;
  SHWBufferLink *local_20;
  long *local_18;
  SHWBufferLink *local_8;
  
  if (in_RSI == (long *)0x0) {
LAB_0033a9e6:
    local_8 = (SHWBufferLink *)0x0;
  }
  else {
    local_18 = in_RSI;
    iVar1 = (**(code **)(*in_RSI + 0xa8))();
    if (iVar1 == 0) {
      iVar1 = (**(code **)(*local_18 + 0xa0))();
      if (iVar1 == 0) goto LAB_0033a9e6;
    }
    _MeshBuffer = (SHWBufferLink *)operator_new(0x38);
    SHWBufferLink_opengl::SHWBufferLink_opengl(in_stack_ffffffffffffffb0,(IMeshBuffer *)_MeshBuffer)
    ;
    this_00 = &in_RDI._M_node[0x10]._M_prev;
    local_20 = _MeshBuffer;
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
         ::end((list<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
                *)_MeshBuffer);
    std::_List_const_iterator<irr::video::CNullDriver::SHWBufferLink_*>::_List_const_iterator
              (&local_30,&local_38);
    local_28 = (_List_node_base *)
               std::__cxx11::
               list<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
               ::insert((list<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
                         *)this_00,in_RDI,(value_type *)_MeshBuffer);
    (local_20->listPosition)._M_node = local_28;
    uVar2 = (*local_20->MeshBuffer->_vptr_IMeshBuffer[0x18])();
    local_20->ChangedID_Vertex = uVar2;
    uVar2 = (*local_20->MeshBuffer->_vptr_IMeshBuffer[0x19])();
    local_20->ChangedID_Index = uVar2;
    EVar3 = (**(code **)(*local_18 + 0xa0))();
    local_20->Mapped_Vertex = EVar3;
    EVar3 = (**(code **)(*local_18 + 0xa8))();
    local_20->Mapped_Index = EVar3;
    *(undefined4 *)&local_20[1]._vptr_SHWBufferLink = 0;
    *(undefined4 *)((long)&local_20[1]._vptr_SHWBufferLink + 4) = 0;
    *(undefined4 *)&local_20[1].MeshBuffer = 0;
    *(undefined4 *)((long)&local_20[1].MeshBuffer + 4) = 0;
    uVar4 = (*(code *)(in_RDI._M_node)->_M_next[0x35]._M_prev)(in_RDI._M_node,local_20);
    if ((uVar4 & 1) == 0) {
      (*(code *)(in_RDI._M_node)->_M_next[0x36]._M_prev)(in_RDI._M_node,local_20);
      local_8 = (SHWBufferLink *)0x0;
    }
    else {
      local_8 = local_20;
    }
  }
  return local_8;
}

Assistant:

COpenGLDriver::SHWBufferLink *COpenGLDriver::createHardwareBuffer(const scene::IMeshBuffer *mb)
{
#if defined(GL_ARB_vertex_buffer_object)
	if (!mb || (mb->getHardwareMappingHint_Index() == scene::EHM_NEVER && mb->getHardwareMappingHint_Vertex() == scene::EHM_NEVER))
		return 0;

	SHWBufferLink_opengl *HWBuffer = new SHWBufferLink_opengl(mb);

	// add to map
	HWBuffer->listPosition = HWBufferList.insert(HWBufferList.end(), HWBuffer);

	HWBuffer->ChangedID_Vertex = HWBuffer->MeshBuffer->getChangedID_Vertex();
	HWBuffer->ChangedID_Index = HWBuffer->MeshBuffer->getChangedID_Index();
	HWBuffer->Mapped_Vertex = mb->getHardwareMappingHint_Vertex();
	HWBuffer->Mapped_Index = mb->getHardwareMappingHint_Index();
	HWBuffer->vbo_verticesID = 0;
	HWBuffer->vbo_indicesID = 0;
	HWBuffer->vbo_verticesSize = 0;
	HWBuffer->vbo_indicesSize = 0;

	if (!updateHardwareBuffer(HWBuffer)) {
		deleteHardwareBuffer(HWBuffer);
		return 0;
	}

	return HWBuffer;
#else
	return 0;
#endif
}